

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

void __thiscall Rml::XMLParser::~XMLParser(XMLParser *this)

{
  (this->super_BaseXMLParser)._vptr_BaseXMLParser = (_func_int **)&PTR__XMLParser_00399ce0;
  ::std::deque<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>::~deque
            (&(this->stack).c);
  ::std::unique_ptr<Rml::DocumentHeader,_std::default_delete<Rml::DocumentHeader>_>::~unique_ptr
            (&this->header);
  BaseXMLParser::~BaseXMLParser(&this->super_BaseXMLParser);
  return;
}

Assistant:

XMLParser::~XMLParser() {}